

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_attr2(lyd_node *parent,char *module_ns,char *name,char *value,lyd_attr **attr)

{
  size_t name_len_00;
  size_t prefix_len;
  char *ctx_00;
  lyd_attr **value_00;
  char *name_00;
  char *module_key;
  char *parent_00;
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  size_t value_len;
  size_t local_d0;
  ly_ctx *local_90;
  size_t sStack_80;
  LY_ERR ret__;
  size_t name_len;
  size_t pref_len;
  char *tmp;
  char *prefix;
  ly_ctx *ctx;
  lyd_attr *ret;
  lyd_attr **attr_local;
  char *value_local;
  char *name_local;
  char *module_ns_local;
  lyd_node *parent_local;
  
  ctx = (ly_ctx *)0x0;
  ret = (lyd_attr *)attr;
  attr_local = (lyd_attr **)value;
  value_local = name;
  name_local = module_ns;
  module_ns_local = (char *)parent;
  if (parent == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent","lyd_new_attr2");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (parent->schema == (lysc_node *)0x0) {
    if (name == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_attr2");
      parent_local._4_4_ = LY_EINVAL;
    }
    else {
      if (parent->schema == (lysc_node *)0x0) {
        local_90 = (ly_ctx *)parent[2].schema;
      }
      else {
        local_90 = parent->schema->module->ctx;
      }
      prefix = (char *)local_90;
      pref_len = (size_t)name;
      LVar1 = ly_parse_nodeid((char **)&pref_len,&tmp,&name_len,&value_local,
                              &stack0xffffffffffffff80);
      if ((LVar1 == LY_SUCCESS) && (*(char *)pref_len == '\0')) {
        if ((name_len == 3) && (iVar2 = strncmp(tmp,"xml",3), iVar2 == 0)) {
          value_local = tmp;
          sStack_80 = name_len + 1 + sStack_80;
          tmp = (char *)0x0;
          name_len = 0;
        }
        if (attr_local == (lyd_attr **)0x0) {
          attr_local = (lyd_attr **)0x254298;
        }
        pcVar3 = strchr((char *)attr_local,0x3a);
        if (pcVar3 != (char *)0x0) {
          ly_log((ly_ctx *)prefix,LY_LLWRN,LY_SUCCESS,
                 "Value \"%s\" prefix will never be interpreted as an XML prefix.",attr_local);
        }
        parent_00 = module_ns_local;
        module_key = name_local;
        name_00 = value_local;
        ctx_00 = prefix;
        pcVar3 = tmp;
        prefix_len = name_len;
        name_len_00 = sStack_80;
        if (name_local == (char *)0x0) {
          local_d0 = 0;
        }
        else {
          local_d0 = strlen(name_local);
        }
        value_00 = attr_local;
        value_len = strlen((char *)attr_local);
        parent_local._4_4_ =
             lyd_create_attr((lyd_node *)parent_00,(lyd_attr **)&ctx,(ly_ctx *)ctx_00,name_00,
                             name_len_00,pcVar3,prefix_len,module_key,local_d0,(char *)value_00,
                             value_len,(ly_bool *)0x0,LY_VALUE_XML,(void *)0x0,0x3f3);
        if (parent_local._4_4_ == LY_SUCCESS) {
          if (ret != (lyd_attr *)0x0) {
            ret->parent = (lyd_node_opaq *)ctx;
          }
          parent_local._4_4_ = LY_SUCCESS;
        }
      }
      else {
        ly_log((ly_ctx *)prefix,LY_LLERR,LY_EINVAL,"Attribute name \"%s\" is not valid.",value_local
              );
        parent_local._4_4_ = LY_EVALID;
      }
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!parent->schema",
           "lyd_new_attr2");
    parent_local._4_4_ = LY_EINVAL;
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_attr2(struct lyd_node *parent, const char *module_ns, const char *name, const char *value,
        struct lyd_attr **attr)
{
    struct lyd_attr *ret = NULL;
    const struct ly_ctx *ctx;
    const char *prefix, *tmp;
    size_t pref_len, name_len;

    LY_CHECK_ARG_RET(NULL, parent, !parent->schema, name, LY_EINVAL);

    ctx = LYD_CTX(parent);

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Attribute name \"%s\" is not valid.", name);
        return LY_EVALID;
    }

    if ((pref_len == 3) && !strncmp(prefix, "xml", 3)) {
        /* not a prefix but special name */
        name = prefix;
        name_len += 1 + pref_len;
        prefix = NULL;
        pref_len = 0;
    }

    /* set value if none */
    if (!value) {
        value = "";
    }
    if (strchr(value, ':')) {
        LOGWRN(ctx, "Value \"%s\" prefix will never be interpreted as an XML prefix.", value);
    }

    LY_CHECK_RET(lyd_create_attr(parent, &ret, ctx, name, name_len, prefix, pref_len, module_ns,
            module_ns ? strlen(module_ns) : 0, value, strlen(value), NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA));

    if (attr) {
        *attr = ret;
    }
    return LY_SUCCESS;
}